

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int pcre2_substring_get_bynumber_16
              (pcre2_match_data_16 *match_data,uint32_t stringnumber,PCRE2_UCHAR16 **stringptr,
              size_t *sizeptr)

{
  int iVar1;
  size_t in_RAX;
  void *pvVar2;
  size_t size;
  
  size = in_RAX;
  iVar1 = pcre2_substring_length_bynumber_16(match_data,stringnumber,&size);
  if (-1 < iVar1) {
    pvVar2 = _pcre2_memctl_malloc_16(size * 0x10 + 0x28,&match_data->memctl);
    if (pvVar2 == (void *)0x0) {
      iVar1 = -0x30;
    }
    else {
      memcpy((PCRE2_UCHAR16 *)((long)pvVar2 + 0x18),
             match_data->subject + match_data->ovector[stringnumber * 2],size * 2);
      *(undefined2 *)((long)pvVar2 + size * 2 + 0x18) = 0;
      *stringptr = (PCRE2_UCHAR16 *)((long)pvVar2 + 0x18);
      *sizeptr = size;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_get_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_UCHAR **stringptr, PCRE2_SIZE *sizeptr)
{
int rc;
PCRE2_SIZE size;
PCRE2_UCHAR *yield;
rc = pcre2_substring_length_bynumber(match_data, stringnumber, &size);
if (rc < 0) return rc;
yield = PRIV(memctl_malloc)(sizeof(pcre2_memctl) +
  (size + 1)*PCRE2_CODE_UNIT_WIDTH, (pcre2_memctl *)match_data);
if (yield == NULL) return PCRE2_ERROR_NOMEMORY;
yield = (PCRE2_UCHAR *)(((char *)yield) + sizeof(pcre2_memctl));
memcpy(yield, match_data->subject + match_data->ovector[stringnumber*2],
  CU2BYTES(size));
yield[size] = 0;
*stringptr = yield;
*sizeptr = size;
return 0;
}